

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O3

void duckdb_zstd::HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  ushort uVar1;
  ushort uVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  void *pvVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  ulong uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  ulong uVar13;
  U64 UVar14;
  ulong uVar15;
  U64 UVar16;
  ulong *puVar17;
  ulong *puVar18;
  ulong uVar19;
  U64 UVar20;
  BYTE *pBVar21;
  ulong uVar22;
  U64 UVar23;
  ulong *local_68;
  ulong *local_60;
  ulong *local_58;
  
  pBVar3 = args->oend;
  pBVar4 = args->ilowest;
  UVar16 = args->bits[0];
  UVar20 = args->bits[1];
  UVar23 = args->bits[2];
  UVar14 = args->bits[3];
  puVar17 = (ulong *)args->ip[0];
  local_58 = (ulong *)args->ip[1];
  local_60 = (ulong *)args->ip[2];
  local_68 = (ulong *)args->ip[3];
  pBVar11 = args->op[0];
  pBVar8 = args->op[1];
  pBVar12 = args->op[3];
  pBVar10 = args->op[2];
  uVar15 = (ulong)((long)pBVar3 - (long)pBVar12) / 5;
  uVar9 = (ulong)((long)puVar17 - (long)pBVar4) / 7;
  if (uVar15 < uVar9) {
    uVar9 = uVar15;
  }
  puVar18 = puVar17;
  if (uVar9 != 0) {
    pvVar5 = args->dt;
    pBVar21 = pBVar12 + uVar9 * 5;
    do {
      if (((local_58 < puVar17) || (local_60 < local_58)) || (local_68 < local_60)) break;
      uVar9 = (long)pBVar3 - (long)pBVar12;
      do {
        puVar17 = puVar18;
        uVar1 = *(ushort *)((long)pvVar5 + (UVar16 >> 0x35) * 2);
        uVar15 = UVar16 << ((ulong)uVar1 & 0x3f);
        *pBVar11 = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (UVar20 >> 0x35) * 2);
        uVar19 = UVar20 << ((ulong)uVar1 & 0x3f);
        *pBVar8 = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (UVar23 >> 0x35) * 2);
        uVar22 = UVar23 << ((ulong)uVar1 & 0x3f);
        *pBVar10 = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (UVar14 >> 0x35) * 2);
        uVar13 = UVar14 << ((ulong)uVar1 & 0x3f);
        *pBVar12 = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar15 >> 0x35) * 2);
        uVar15 = uVar15 << ((ulong)uVar1 & 0x3f);
        pBVar11[1] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar19 >> 0x35) * 2);
        uVar19 = uVar19 << ((ulong)uVar1 & 0x3f);
        pBVar8[1] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar22 >> 0x35) * 2);
        uVar22 = uVar22 << ((ulong)uVar1 & 0x3f);
        pBVar10[1] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar13 >> 0x35) * 2);
        uVar13 = uVar13 << ((ulong)uVar1 & 0x3f);
        pBVar12[1] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar15 >> 0x35) * 2);
        uVar15 = uVar15 << ((ulong)uVar1 & 0x3f);
        pBVar11[2] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar19 >> 0x35) * 2);
        uVar19 = uVar19 << ((ulong)uVar1 & 0x3f);
        pBVar8[2] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar22 >> 0x35) * 2);
        uVar22 = uVar22 << ((ulong)uVar1 & 0x3f);
        pBVar10[2] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar13 >> 0x35) * 2);
        uVar13 = uVar13 << ((ulong)uVar1 & 0x3f);
        pBVar12[2] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar15 >> 0x35) * 2);
        uVar15 = uVar15 << ((ulong)uVar1 & 0x3f);
        pBVar11[3] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar19 >> 0x35) * 2);
        uVar19 = uVar19 << ((ulong)uVar1 & 0x3f);
        pBVar8[3] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar22 >> 0x35) * 2);
        uVar22 = uVar22 << ((ulong)uVar1 & 0x3f);
        pBVar10[3] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar13 >> 0x35) * 2);
        uVar13 = uVar13 << ((ulong)uVar1 & 0x3f);
        pBVar12[3] = (BYTE)(uVar1 >> 8);
        uVar1 = *(ushort *)((long)pvVar5 + (uVar15 >> 0x35) * 2);
        pBVar11[4] = (BYTE)(uVar1 >> 8);
        uVar2 = *(ushort *)((long)pvVar5 + (uVar19 >> 0x35) * 2);
        uVar19 = uVar19 << ((ulong)uVar2 & 0x3f);
        pBVar8[4] = (BYTE)(uVar2 >> 8);
        uVar2 = *(ushort *)((long)pvVar5 + (uVar22 >> 0x35) * 2);
        uVar22 = uVar22 << ((ulong)uVar2 & 0x3f);
        pBVar10[4] = (BYTE)(uVar2 >> 8);
        uVar2 = *(ushort *)((long)pvVar5 + (uVar13 >> 0x35) * 2);
        uVar13 = uVar13 << ((ulong)uVar2 & 0x3f);
        pBVar12[4] = (BYTE)(uVar2 >> 8);
        uVar6 = 0;
        for (uVar15 = uVar15 << ((ulong)uVar1 & 0x3f); (uVar15 & 1) == 0;
            uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          uVar6 = uVar6 + 1;
        }
        puVar18 = (ulong *)((long)puVar17 - (ulong)(uVar6 >> 3));
        UVar16 = (*puVar18 | 1) << ((byte)uVar6 & 7);
        uVar7 = 0;
        for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          uVar7 = uVar7 + 1;
        }
        local_58 = (ulong *)((long)local_58 - (ulong)(uVar7 >> 3));
        UVar20 = (*local_58 | 1) << ((byte)uVar7 & 7);
        uVar7 = 0;
        for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          uVar7 = uVar7 + 1;
        }
        local_60 = (ulong *)((long)local_60 - (ulong)(uVar7 >> 3));
        UVar23 = (*local_60 | 1) << ((byte)uVar7 & 7);
        uVar7 = 0;
        for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
          uVar7 = uVar7 + 1;
        }
        local_68 = (ulong *)((long)local_68 - (ulong)(uVar7 >> 3));
        UVar14 = (*local_68 | 1) << ((byte)uVar7 & 7);
        pBVar11 = pBVar11 + 5;
        pBVar8 = pBVar8 + 5;
        pBVar10 = pBVar10 + 5;
        pBVar12 = pBVar12 + 5;
        uVar9 = uVar9 - 5;
      } while (pBVar12 < pBVar21);
      puVar17 = (ulong *)((long)puVar17 - (ulong)(uVar6 >> 3));
      uVar15 = (ulong)((long)puVar17 - (long)pBVar4) / 7;
      if (uVar9 / 5 < uVar15) {
        uVar15 = uVar9 / 5;
      }
      pBVar21 = pBVar12 + uVar15 * 5;
    } while (uVar15 != 0);
  }
  args->bits[0] = UVar16;
  args->bits[1] = UVar20;
  args->bits[2] = UVar23;
  args->bits[3] = UVar14;
  args->ip[0] = (BYTE *)puVar18;
  args->ip[1] = (BYTE *)local_58;
  args->ip[2] = (BYTE *)local_60;
  args->ip[3] = (BYTE *)local_68;
  args->op[0] = pBVar11;
  args->op[1] = pBVar8;
  args->op[2] = pBVar10;
  args->op[3] = pBVar12;
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    U16 const* const dtable = (U16 const*)args->dt;
    BYTE* const oend = args->oend;
    BYTE const* const ilowest = args->ilowest;

    /* Copy the arguments to local variables */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= (stream == 3 ? oend : op[stream + 1]));
            assert(ip[stream] >= ilowest);
        }
#endif
        /* Compute olimit */
        {
            /* Each iteration produces 5 output symbols per stream */
            size_t const oiters = (size_t)(oend - op[3]) / 5;
            /* Each iteration consumes up to 11 bits * 5 = 55 bits < 7 bytes
             * per stream.
             */
            size_t const iiters = (size_t)(ip[0] - ilowest) / 7;
            /* We can safely run iters iterations before running bounds checks */
            size_t const iters = MIN(oiters, iiters);
            size_t const symbols = iters * 5;

            /* We can simply check that op[3] < olimit, instead of checking all
             * of our bounds, since we can't hit the other bounds until we've run
             * iters iterations, which only happens when op[3] == olimit.
             */
            olimit = op[3] + symbols;

            /* Exit fast decoding loop once we reach the end. */
            if (op[3] == olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

#define HUF_4X1_DECODE_SYMBOL(_stream, _symbol)                 \
    do {                                                        \
        int const index = (int)(bits[(_stream)] >> 53);         \
        int const entry = (int)dtable[index];                   \
        bits[(_stream)] <<= (entry & 0x3F);                     \
        op[(_stream)][(_symbol)] = (BYTE)((entry >> 8) & 0xFF); \
    } while (0)

#define HUF_4X1_RELOAD_STREAM(_stream)                              \
    do {                                                            \
        int const ctz = ZSTD_countTrailingZeros64(bits[(_stream)]); \
        int const nbBits = ctz & 7;                                 \
        int const nbBytes = ctz >> 3;                               \
        op[(_stream)] += 5;                                         \
        ip[(_stream)] -= nbBytes;                                   \
        bits[(_stream)] = MEM_read64(ip[(_stream)]) | 1;            \
        bits[(_stream)] <<= nbBits;                                 \
    } while (0)

        /* Manually unroll the loop because compilers don't consistently
         * unroll the inner loops, which destroys performance.
         */
        do {
            /* Decode 5 symbols in each of the 4 streams */
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 1);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 2);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 3);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 4);

            /* Reload each of the 4 the bitstreams */
            HUF_4X_FOR_EACH_STREAM(HUF_4X1_RELOAD_STREAM);
        } while (op[3] < olimit);

#undef HUF_4X1_DECODE_SYMBOL
#undef HUF_4X1_RELOAD_STREAM
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}